

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O3

float sptk::snack::wind_energy
                (float *data,int size,int w_type,int *nwindp,float **dwindp,int *n0p,float **dinp,
                int *wsizep,float **windp)

{
  int iVar1;
  uint uVar2;
  float *dout;
  long lVar3;
  float fVar4;
  float fVar5;
  
  iVar1 = *nwindp;
  dout = *dwindp;
  if (iVar1 < size) {
    if (dout == (float *)0x0) {
      dout = (float *)malloc((long)size << 2);
    }
    else {
      dout = (float *)realloc(dout,(long)size << 2);
    }
    if (dout == (float *)0x0) {
      wind_energy();
      return 0.0;
    }
    *dwindp = dout;
  }
  if (iVar1 != size) {
    xget_window(dout,size,w_type,n0p,dinp,wsizep,windp);
    *nwindp = size;
  }
  fVar4 = 0.0;
  if (0 < size) {
    uVar2 = size + 1;
    lVar3 = 0;
    do {
      fVar5 = *(float *)((long)dout + lVar3) * *(float *)((long)data + lVar3);
      fVar4 = fVar4 + fVar5 * fVar5;
      uVar2 = uVar2 - 1;
      lVar3 = lVar3 + 4;
    } while (1 < uVar2);
  }
  fVar4 = fVar4 / (float)size;
  if (0.0 <= fVar4) {
    return SQRT(fVar4);
  }
  fVar4 = sqrtf(fVar4);
  return fVar4;
}

Assistant:

float wind_energy(float *data, int size, int w_type, int *nwindp,
                  float **dwindp, int *n0p, float **dinp, int *wsizep,
                  float **windp)
#endif
{
#if 0
  static int nwind = 0;
  static float *dwind = NULL;
#else
  int nwind = *nwindp;
  float *dwind = *dwindp;
#endif
  register float *dp, sum, f;
  register int i;

  if(nwind < size) {
    if(dwind) dwind = (float*)ckrealloc((void *)dwind,size*sizeof(float));
    else dwind = (float*)ckalloc(size*sizeof(float));
    if(!dwind) {
      Fprintf(stderr,"Can't allocate scratch memory in wind_energy()\n");
      return(0.0);
    }
#if 1
    *dwindp = dwind;
#endif
  }
  if(nwind != size) {
#if 0
    xget_window(dwind, size, w_type);
    nwind = size;
#else
    xget_window(dwind, size, w_type, n0p, dinp, wsizep, windp);
    *nwindp = size;
#endif
  }
  for(i=size, dp = dwind, sum = 0.0; i-- > 0; ) {
    f = *dp++ * (float)(*data++);
    sum += f*f;
  }
  return((float)sqrt((double)(sum/size)));
}